

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_sad_intrin_avx2.c
# Opt level: O0

uint highbd_masked_sad16xh_avx2
               (uint8_t *src8,int src_stride,uint8_t *a8,int a_stride,uint8_t *b8,int b_stride,
               uint8_t *m_ptr,int m_stride,int width,int height)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  undefined1 auVar12 [16];
  long in_stack_00000008;
  int sad;
  __m256i pred;
  __m256i pred_r;
  __m256i mask_r;
  __m256i data_r;
  __m256i pred_l;
  __m256i mask_l;
  __m256i data_l;
  __m256i m_inv;
  __m256i m;
  __m256i b;
  __m256i a;
  __m256i src;
  __m256i one;
  __m256i round_const;
  __m256i mask_max;
  __m256i res;
  int y;
  int x;
  uint16_t *b_ptr;
  uint16_t *a_ptr;
  uint16_t *src_ptr;
  undefined1 local_660 [32];
  undefined4 local_630;
  undefined4 local_62c;
  undefined8 local_628;
  undefined8 local_620;
  undefined8 local_618;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  local_618 = in_RDI * 2;
  local_620 = in_RDX * 2;
  local_628 = in_R8 * 2;
  local_660 = ZEXT1632(ZEXT816(0));
  auVar5 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar5 = vpinsrw_avx(auVar5,0x40,2);
  auVar5 = vpinsrw_avx(auVar5,0x40,3);
  auVar5 = vpinsrw_avx(auVar5,0x40,4);
  auVar5 = vpinsrw_avx(auVar5,0x40,5);
  auVar5 = vpinsrw_avx(auVar5,0x40,6);
  auVar6 = vpinsrw_avx(auVar5,0x40,7);
  auVar5 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar5 = vpinsrw_avx(auVar5,0x40,2);
  auVar5 = vpinsrw_avx(auVar5,0x40,3);
  auVar5 = vpinsrw_avx(auVar5,0x40,4);
  auVar5 = vpinsrw_avx(auVar5,0x40,5);
  auVar5 = vpinsrw_avx(auVar5,0x40,6);
  auVar5 = vpinsrw_avx(auVar5,0x40,7);
  uStack_450 = auVar5._0_8_;
  uStack_448 = auVar5._8_8_;
  auVar5 = vpinsrd_avx(ZEXT416(0x20),0x20,1);
  auVar5 = vpinsrd_avx(auVar5,0x20,2);
  auVar5 = vpinsrd_avx(auVar5,0x20,3);
  auVar4 = vpinsrd_avx(ZEXT416(0x20),0x20,1);
  auVar4 = vpinsrd_avx(auVar4,0x20,2);
  auVar4 = vpinsrd_avx(auVar4,0x20,3);
  uStack_70 = auVar4._0_8_;
  uStack_68 = auVar4._8_8_;
  auVar4 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar4 = vpinsrw_avx(auVar4,1,2);
  auVar4 = vpinsrw_avx(auVar4,1,3);
  auVar4 = vpinsrw_avx(auVar4,1,4);
  auVar4 = vpinsrw_avx(auVar4,1,5);
  auVar4 = vpinsrw_avx(auVar4,1,6);
  auVar4 = vpinsrw_avx(auVar4,1,7);
  auVar7 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar7 = vpinsrw_avx(auVar7,1,2);
  auVar7 = vpinsrw_avx(auVar7,1,3);
  auVar7 = vpinsrw_avx(auVar7,1,4);
  auVar7 = vpinsrw_avx(auVar7,1,5);
  auVar7 = vpinsrw_avx(auVar7,1,6);
  auVar7 = vpinsrw_avx(auVar7,1,7);
  auVar12 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar4;
  uStack_410 = auVar12._0_8_;
  uStack_408 = auVar12._8_8_;
  for (local_630 = 0; local_630 < width; local_630 = local_630 + 1) {
    for (local_62c = 0; local_62c < m_stride; local_62c = local_62c + 0x10) {
      auVar1 = vlddqu_avx(*(undefined1 (*) [32])(local_618 + (long)local_62c * 2));
      auVar2 = vlddqu_avx(*(undefined1 (*) [32])(local_620 + (long)local_62c * 2));
      auVar3 = vlddqu_avx(*(undefined1 (*) [32])(local_628 + (long)local_62c * 2));
      auVar12 = vlddqu_avx(*(undefined1 (*) [16])(in_stack_00000008 + local_62c));
      auVar8 = vpmovzxbw_avx2(auVar12);
      auVar10._16_8_ = uStack_450;
      auVar10._0_16_ = auVar6;
      auVar10._24_8_ = uStack_448;
      auVar9 = vpsubw_avx2(auVar10,auVar8);
      auVar10 = vpunpcklwd_avx2(auVar2,auVar3);
      auVar11 = vpunpcklwd_avx2(auVar8,auVar9);
      auVar10 = vpmaddwd_avx2(auVar10,auVar11);
      auVar11._16_8_ = uStack_70;
      auVar11._0_16_ = auVar5;
      auVar11._24_8_ = uStack_68;
      auVar10 = vpaddd_avx2(auVar10,auVar11);
      auVar10 = vpsrad_avx2(auVar10,ZEXT416(6));
      auVar2 = vpunpckhwd_avx2(auVar2,auVar3);
      auVar3 = vpunpckhwd_avx2(auVar8,auVar9);
      auVar2 = vpmaddwd_avx2(auVar2,auVar3);
      auVar3._16_8_ = uStack_70;
      auVar3._0_16_ = auVar5;
      auVar3._24_8_ = uStack_68;
      auVar2 = vpaddd_avx2(auVar2,auVar3);
      auVar2 = vpsrad_avx2(auVar2,ZEXT416(6));
      auVar2 = vpackssdw_avx2(auVar10,auVar2);
      auVar1 = vpsubw_avx2(auVar2,auVar1);
      auVar1 = vpabsw_avx2(auVar1);
      auVar2._16_8_ = uStack_410;
      auVar2._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar7;
      auVar2._24_8_ = uStack_408;
      auVar1 = vpmaddwd_avx2(auVar1,auVar2);
      local_660 = vpaddd_avx2(local_660,auVar1);
    }
    local_618 = local_618 + (long)in_ESI * 2;
    local_620 = local_620 + (long)in_ECX * 2;
    local_628 = local_628 + (long)in_R9D * 2;
    in_stack_00000008 = in_stack_00000008 + (int)m_ptr;
  }
  auVar1 = vphaddd_avx2(local_660,local_660);
  auVar1 = vphaddd_avx2(auVar1,auVar1);
  local_660._0_4_ = auVar1._0_4_;
  local_660._16_4_ = auVar1._16_4_;
  return local_660._0_4_ + local_660._16_4_;
}

Assistant:

static inline unsigned int highbd_masked_sad16xh_avx2(
    const uint8_t *src8, int src_stride, const uint8_t *a8, int a_stride,
    const uint8_t *b8, int b_stride, const uint8_t *m_ptr, int m_stride,
    int width, int height) {
  const uint16_t *src_ptr = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *a_ptr = CONVERT_TO_SHORTPTR(a8);
  const uint16_t *b_ptr = CONVERT_TO_SHORTPTR(b8);
  int x, y;
  __m256i res = _mm256_setzero_si256();
  const __m256i mask_max = _mm256_set1_epi16((1 << AOM_BLEND_A64_ROUND_BITS));
  const __m256i round_const =
      _mm256_set1_epi32((1 << AOM_BLEND_A64_ROUND_BITS) >> 1);
  const __m256i one = _mm256_set1_epi16(1);

  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x += 16) {
      const __m256i src = _mm256_lddqu_si256((const __m256i *)&src_ptr[x]);
      const __m256i a = _mm256_lddqu_si256((const __m256i *)&a_ptr[x]);
      const __m256i b = _mm256_lddqu_si256((const __m256i *)&b_ptr[x]);
      // Zero-extend mask to 16 bits
      const __m256i m =
          _mm256_cvtepu8_epi16(_mm_lddqu_si128((const __m128i *)&m_ptr[x]));
      const __m256i m_inv = _mm256_sub_epi16(mask_max, m);

      const __m256i data_l = _mm256_unpacklo_epi16(a, b);
      const __m256i mask_l = _mm256_unpacklo_epi16(m, m_inv);
      __m256i pred_l = _mm256_madd_epi16(data_l, mask_l);
      pred_l = _mm256_srai_epi32(_mm256_add_epi32(pred_l, round_const),
                                 AOM_BLEND_A64_ROUND_BITS);

      const __m256i data_r = _mm256_unpackhi_epi16(a, b);
      const __m256i mask_r = _mm256_unpackhi_epi16(m, m_inv);
      __m256i pred_r = _mm256_madd_epi16(data_r, mask_r);
      pred_r = _mm256_srai_epi32(_mm256_add_epi32(pred_r, round_const),
                                 AOM_BLEND_A64_ROUND_BITS);

      // Note: the maximum value in pred_l/r is (2^bd)-1 < 2^15,
      // so it is safe to do signed saturation here.
      const __m256i pred = _mm256_packs_epi32(pred_l, pred_r);
      // There is no 16-bit SAD instruction, so we have to synthesize
      // an 8-element SAD. We do this by storing 4 32-bit partial SADs,
      // and accumulating them at the end
      const __m256i diff = _mm256_abs_epi16(_mm256_sub_epi16(pred, src));
      res = _mm256_add_epi32(res, _mm256_madd_epi16(diff, one));
    }

    src_ptr += src_stride;
    a_ptr += a_stride;
    b_ptr += b_stride;
    m_ptr += m_stride;
  }
  // At this point, we have four 32-bit partial SADs stored in 'res'.
  res = _mm256_hadd_epi32(res, res);
  res = _mm256_hadd_epi32(res, res);
  int sad = _mm256_extract_epi32(res, 0) + _mm256_extract_epi32(res, 4);
  return sad;
}